

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *
parseFunctionInvocationLike<FunctionInvocationExpressionAstNode>
          (optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *__return_storage_ptr__,
          Parser *parser,TokenType tokenTypeToExpect)

{
  bool *this;
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *poVar3;
  TokenType type;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 local_f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [24];
  shared_ptr<Token> identifier;
  vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
  arguments;
  undefined1 local_78 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> arg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *local_40;
  allocator<char> local_32;
  char local_31;
  bool error;
  
  local_31 = '\0';
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected an identifier for function invocation",(allocator<char> *)local_78);
  type = (TokenType)parser;
  local_40 = __return_storage_ptr__;
  Parser::expect((Parser *)(local_b8 + 0x10),type,(bool *)(ulong)tokenTypeToExpect,
                 (string *)&local_31);
  std::__cxx11::string::~string
            ((string *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  Parser::skipWhiteSpace(parser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected left paren for function invocation",(allocator<char> *)local_78);
  this = &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  Parser::expect((Parser *)local_f8,type,(bool *)0x5,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
  std::__cxx11::string::~string((string *)this);
  while( true ) {
    Parser::skipWhiteSpace(parser);
    TokenBuffer::currentToken((TokenBuffer *)this);
    iVar1 = *(int *)(arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                     .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
                    0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
                 "Expected a right paren to close function invocation",(allocator<char> *)local_78);
      Parser::expect((Parser *)(local_f8 + 0x10),type,(bool *)0x6,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
      std::__cxx11::string::~string
                ((string *)
                 &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
      goto LAB_0010d662;
    }
    TokenBuffer::currentToken((TokenBuffer *)this);
    iVar1 = *(int *)(arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                     .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
                    0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    if (iVar1 == 6) break;
    Parser::parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_78,parser);
    if (arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\0')
    {
      local_31 = '\x01';
    }
    else {
      std::
      vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ::push_back((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                   *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (value_type *)local_78);
    }
    TokenBuffer::currentToken((TokenBuffer *)this);
    iVar1 = *(int *)(arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                     .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
                    0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    if (iVar1 == 6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this,"Expected a right paren to close function invocation",&local_32);
      Parser::expect((Parser *)(local_d8 + 0x10),type,(bool *)0x6,(string *)&local_31);
      this_00 = &local_c0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this,"Expected a comma between function arguments",&local_32);
      Parser::expect((Parser *)local_b8,type,(bool *)0x13,(string *)&local_31);
      this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    std::__cxx11::string::~string((string *)this);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_78);
    if (iVar1 == 6) {
LAB_0010d65c:
      if (local_31 == '\x01') {
LAB_0010d662:
        (local_40->
        super__Optional_base<std::shared_ptr<FunctionInvocationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<FunctionInvocationExpressionAstNode>_>.
        _M_engaged = false;
        poVar3 = local_40;
      }
      else {
        std::
        make_shared<FunctionInvocationExpressionAstNode,std::shared_ptr<Token>&,std::vector<std::shared_ptr<ExpressionAstNode>,std::allocator<std::shared_ptr<ExpressionAstNode>>>&>
                  ((shared_ptr<Token> *)
                   &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                    _M_payload.
                    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
                   (vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                    *)(local_b8 + 0x10));
        poVar3 = local_40;
        _Var2._M_pi = local_58[0]._M_pi;
        (local_40->
        super__Optional_base<std::shared_ptr<FunctionInvocationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<FunctionInvocationExpressionAstNode>_>.
        _M_payload._M_value.
        super___shared_ptr<FunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
             super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
        local_58[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&(local_40->
                super__Optional_base<std::shared_ptr<FunctionInvocationExpressionAstNode>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true,_false,_false>
                .super__Optional_payload_base<std::shared_ptr<FunctionInvocationExpressionAstNode>_>
                ._M_payload._M_value.
                super___shared_ptr<FunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>
        + 8))->_M_pi = _Var2._M_pi;
        arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
        arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
        (local_40->
        super__Optional_base<std::shared_ptr<FunctionInvocationExpressionAstNode>,_false,_false>).
        _M_payload.
        super__Optional_payload<std::shared_ptr<FunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<FunctionInvocationExpressionAstNode>_>.
        _M_engaged = true;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier);
      std::
      vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ::~vector((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                 *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return poVar3;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a right paren to close function invocation",(allocator<char> *)local_78);
  Parser::expect((Parser *)local_d8,type,(bool *)0x6,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  std::__cxx11::string::~string
            ((string *)
             &arg.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  goto LAB_0010d65c;
}

Assistant:

const std::optional<std::shared_ptr<T>> parseFunctionInvocationLike(Parser* parser, TokenType tokenTypeToExpect) {
  bool error = false;
  std::vector<std::shared_ptr<ExpressionAstNode>> arguments;

  auto identifier = parser->expect(tokenTypeToExpect, error,
    "Expected an identifier for function invocation");

  parser->skipWhiteSpace();

  parser->expect(TokenType::LeftParen, error, "Expected left paren for function invocation");

  while (true) {
    parser->skipWhiteSpace();

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      return std::nullopt;
    }

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      break;
    }

    auto arg = parser->parseExpression();

    if (!arg) {
      error = true;

    } else {
      arguments.push_back(arg.value());
    }

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      break;
    }

    parser->expect(TokenType::Comma, error, "Expected a comma between function arguments");
  }

  if (error) { return std::nullopt; }

  return std::make_shared<T>(identifier, arguments);
}